

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int prolog0(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  pcVar2 = prolog1;
  iVar1 = 0;
  switch(tok) {
  case 0xb:
  case 0xd:
  case 0xf:
    goto switchD_0015fcd7_caseD_b;
  case 0xc:
    iVar1 = 1;
    goto switchD_0015fcd7_caseD_b;
  case 0xe:
    return 0;
  case 0x10:
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"DOCTYPE");
    if (iVar1 != 0) {
      pcVar2 = doctype0;
      iVar1 = 0;
      goto switchD_0015fcd7_caseD_b;
    }
    break;
  default:
    if (tok == 0x1d) {
      pcVar2 = error;
      iVar1 = 2;
      goto switchD_0015fcd7_caseD_b;
    }
  }
  pcVar2 = error;
  iVar1 = -1;
  if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x34;
  }
switchD_0015fcd7_caseD_b:
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static
int prolog0(PROLOG_STATE *state,
            int tok,
            const char *ptr,
            const char *end,
            const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    state->handler = prolog1;
    return XML_ROLE_NONE;
  case XML_TOK_XML_DECL:
    state->handler = prolog1;
    return XML_ROLE_XML_DECL;
  case XML_TOK_PI:
    state->handler = prolog1;
    return XML_ROLE_NONE;
  case XML_TOK_COMMENT:
    state->handler = prolog1;
  case XML_TOK_BOM:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_OPEN:
    if (!XmlNameMatchesAscii(enc,
                             ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                             end,
                             KW_DOCTYPE))
      break;
    state->handler = doctype0;
    return XML_ROLE_NONE;
  case XML_TOK_INSTANCE_START:
    state->handler = error;
    return XML_ROLE_INSTANCE_START;
  }
  return common(state, tok);
}